

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O1

void Cmd_save(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *in_RAX;
  char *pcVar2;
  FString fname;
  FString local_18;
  
  local_18.Chars = in_RAX;
  iVar1 = FCommandLine::argc(argv);
  if (1 < iVar1) {
    iVar1 = FCommandLine::argc(argv);
    if (iVar1 < 4) {
      pcVar2 = FCommandLine::operator[](argv,1);
      FString::FString(&local_18,pcVar2);
      DefaultExtension(&local_18,".zds");
      iVar1 = FCommandLine::argc(argv);
      pcVar2 = FCommandLine::operator[](argv,(2 < iVar1) + 1);
      G_SaveGame(local_18.Chars,pcVar2);
      FString::~FString(&local_18);
      return;
    }
  }
  Printf("usage: save <filename> [description]\n");
  return;
}

Assistant:

CCMD (save)
{
    if (argv.argc() < 2 || argv.argc() > 3)
	{
        Printf ("usage: save <filename> [description]\n");
        return;
    }
    FString fname = argv[1];
	DefaultExtension (fname, "." SAVEGAME_EXT);
	G_SaveGame (fname, argv.argc() > 2 ? argv[2] : argv[1]);
}